

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O3

void __thiscall HighsIis::addCol(HighsIis *this,HighsInt col,HighsInt status)

{
  iterator iVar1;
  HighsInt local_18;
  HighsInt local_14;
  
  _local_18 = CONCAT44(col,status);
  iVar1._M_current =
       (this->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->col_index_,iVar1,&local_14);
  }
  else {
    *iVar1._M_current = col;
    (this->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->col_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->col_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->col_bound_,iVar1,&local_18);
  }
  else {
    *iVar1._M_current = status;
    (this->col_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = iVar1._M_current + 1;
  }
  return;
}

Assistant:

void HighsIis::addCol(const HighsInt col, const HighsInt status) {
  this->col_index_.push_back(col);
  this->col_bound_.push_back(status);
}